

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.c
# Opt level: O3

void matras_destroy_read_view(matras *m,matras_view *v)

{
  uint uVar1;
  matras_id_t mVar2;
  matras_id_t mVar3;
  matras_view *pmVar4;
  matras_view *pmVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  matras_stats *pmVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  void *local_68;
  void *local_58;
  void *local_40;
  
  if ((matras *)v == m) {
    __assert_fail("v != &m->head",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/matras.c"
                  ,0x18b,"void matras_destroy_read_view(struct matras *, struct matras_view *)");
  }
  pmVar4 = v->next_view;
  if (pmVar4 != (matras_view *)0x0) {
    pmVar5 = v->prev_view;
    pmVar4->prev_view = pmVar5;
    if (pmVar5 != (matras_view *)0x0) {
      pmVar5->next_view = pmVar4;
    }
    v->next_view = (matras_view *)0x0;
    uVar11 = v->block_count;
    if (uVar11 != 0) {
      pvVar6 = v->root;
      pvVar7 = pmVar4->root;
      if ((pvVar6 != pvVar7) || (pmVar4->block_count == 0)) {
        uVar12 = 0;
        if (pmVar5 == (matras_view *)0x0) {
          local_58 = (void *)0x0;
        }
        else {
          local_58 = pmVar5->root;
          if ((pvVar6 == local_58) && (pmVar5->block_count != 0)) {
            return;
          }
        }
        uVar1 = m->extent_size;
        mVar2 = m->mask1;
        mVar3 = m->mask2;
        uVar13 = 0;
        do {
          uVar14 = (ulong)uVar13;
          pvVar8 = *(void **)((long)pvVar6 + uVar14 * 8);
          if (uVar12 < pmVar4->block_count) {
            local_68 = *(void **)((long)pvVar7 + uVar14 * 8);
            if (pvVar8 != local_68) goto LAB_0010500d;
          }
          else {
            local_68 = (void *)0x0;
LAB_0010500d:
            if ((pmVar5 == (matras_view *)0x0) || (pmVar5->block_count <= uVar12)) {
              local_40 = (void *)0x0;
            }
            else {
              local_40 = *(void **)((long)local_58 + uVar14 * 8);
              if (pvVar8 == local_40) goto LAB_001050d2;
            }
            if (7 < uVar1) {
              uVar14 = 0;
              uVar11 = uVar12;
              do {
                if (v->block_count <= uVar11) break;
                pvVar9 = *(void **)((long)pvVar8 + uVar14 * 8);
                if (((pmVar4->block_count <= uVar11) ||
                    (pvVar9 != *(void **)((long)local_68 + uVar14 * 8))) &&
                   ((pmVar5 == (matras_view *)0x0 ||
                    ((pmVar5->block_count <= uVar11 ||
                     (pvVar9 != *(void **)((long)local_40 + uVar14 * 8))))))) {
                  (*m->allocator->free_func)(m->allocator,pvVar9);
                  m->extent_count = m->extent_count - 1;
                  pmVar10 = m->stats;
                  pmVar10->extent_count = pmVar10->extent_count - 1;
                  pmVar10->read_view_extent_count = pmVar10->read_view_extent_count - 1;
                }
                uVar14 = uVar14 + 1;
                uVar11 = (ulong)((int)uVar11 + mVar3 + 1);
              } while (uVar1 >> 3 != uVar14);
            }
            (*m->allocator->free_func)(m->allocator,pvVar8);
            m->extent_count = m->extent_count - 1;
            pmVar10 = m->stats;
            pmVar10->extent_count = pmVar10->extent_count - 1;
            pmVar10->read_view_extent_count = pmVar10->read_view_extent_count - 1;
            uVar11 = v->block_count;
          }
LAB_001050d2:
          uVar13 = uVar13 + 1;
          uVar12 = (ulong)((int)uVar12 + mVar2 + 1);
        } while (uVar12 < uVar11);
        (*m->allocator->free_func)(m->allocator,pvVar6);
        m->extent_count = m->extent_count - 1;
        pmVar10 = m->stats;
        pmVar10->extent_count = pmVar10->extent_count - 1;
        pmVar10->read_view_extent_count = pmVar10->read_view_extent_count - 1;
      }
    }
  }
  return;
}

Assistant:

void
matras_destroy_read_view(struct matras *m, struct matras_view *v)
{
	assert(v != &m->head);
	if (!v->next_view)
		return;
	struct matras_view *next_view = v->next_view;
	struct matras_view *prev_view = v->prev_view;
	next_view->prev_view = prev_view;
	if (prev_view)
		prev_view->next_view = next_view;
	v->next_view = 0;

	if (v->block_count == 0)
		return;
	if (v->root == next_view->root && next_view->block_count)
		return;
	if (prev_view && v->root == prev_view->root && prev_view->block_count)
		return;
	void **extent1 = (void **)v->root;
	void **extent1n = (void **) next_view->root;
	void **extent1p = 0;
	if (prev_view)
		extent1p = (void **) prev_view->root;
	matras_id_t step1 = m->mask1 + 1;
	matras_id_t step2 = m->mask2 + 1;
	matras_id_t i1 = 0, j1 = 0, i2, j2;
	matras_id_t ptrs_in_ext = m->extent_size / (matras_id_t)sizeof(void *);
	for (; j1 < v->block_count; i1++, j1 += step1) {
		void **extent2 = (void **)extent1[i1];
		void **extent2n = 0;
		void **extent2p = 0;
		if (next_view->block_count > j1) {
			if (extent1[i1] == extent1n[i1])
				continue;
			extent2n = (void **) extent1n[i1];
		}
		if (prev_view && prev_view->block_count > j1) {
			if (extent1[i1] == extent1p[i1])
				continue;
			extent2p = (void **) extent1p[i1];
		}
		for (i2 = j2 = 0;
		     i2 < ptrs_in_ext && j1 + j2 < v->block_count;
		     i2++, j2 += step2) {
			void **extent3 = (void **)extent2[i2];
			if (next_view->block_count > j1 + j2) {
				if (extent2[i2] == extent2n[i2])
					continue;
			}
			if (prev_view && prev_view->block_count > j1 + j2) {
				if (extent2[i2] == extent2p[i2])
					continue;
			}
			matras_free_read_view_extent(m, extent3);
		}
		matras_free_read_view_extent(m, extent2);
	}
	matras_free_read_view_extent(m, extent1);
}